

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O1

SeatPromptResult *
tempseat_get_userpass_input(SeatPromptResult *__return_storage_ptr__,Seat *seat,prompts_t *p)

{
  __assert_fail("false && \"get_userpass_input should never be called on TempSeat\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                ,0xf1,"SeatPromptResult tempseat_get_userpass_input(Seat *, prompts_t *)");
}

Assistant:

static SeatPromptResult tempseat_get_userpass_input(Seat *seat, prompts_t *p)
{
    /*
     * Interactive prompts of this nature are a thing that a backend
     * MUST NOT do while not in possession of the real Seat, because
     * the whole point of temporarily lending the real Seat to
     * something else is that so it can have a clear field to do
     * interactive stuff of its own while making a network connection.
     */
    unreachable("get_userpass_input should never be called on TempSeat");
}